

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

void __thiscall
particleSamples::filter_particles
          (particleSamples *this,int PoI_monval,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *full_list,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *filted_list)

{
  bool bVar1;
  particleSamples *this_00;
  value_type *in_RCX;
  undefined8 in_RDX;
  vector<particle_info,_std::allocator<particle_info>_> *in_RDI;
  bool pick_flag;
  anon_struct_120_15_f999644b *part_i;
  iterator __end2;
  iterator __begin2;
  vector<particle_info,_std::allocator<particle_info>_> *__range2;
  vector<particle_info,_std::allocator<particle_info>_> **ev_i;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *__range1;
  int i;
  vector<particle_info,_std::allocator<particle_info>_> *in_stack_ffffffffffffff68;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_ffffffffffffff70;
  value_type *__x;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  particleSamples *in_stack_ffffffffffffff90;
  __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
  local_60;
  vector<particle_info,_std::allocator<particle_info>_> *local_58;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *local_50;
  reference local_48;
  vector<particle_info,_std::allocator<particle_info>_> **local_40;
  __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
  local_38;
  undefined8 local_30;
  int local_24;
  value_type *local_20;
  undefined8 local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  clear_out_previous_record
            (in_stack_ffffffffffffff90,
             (vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
              *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_24 = 0;
  local_30 = local_18;
  local_38._M_current =
       (vector<particle_info,_std::allocator<particle_info>_> **)
       std::
       vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
       ::begin((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                *)in_stack_ffffffffffffff68);
  local_40 = (vector<particle_info,_std::allocator<particle_info>_> **)
             std::
             vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
             ::end((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                    *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
               ::operator*(&local_38);
    __x = local_20;
    in_stack_ffffffffffffff70 =
         (vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *)operator_new(0x18);
    std::vector<particle_info,_std::allocator<particle_info>_>::vector
              ((vector<particle_info,_std::allocator<particle_info>_> *)0x14e9d5);
    local_50 = in_stack_ffffffffffffff70;
    std::
    vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
    ::push_back(in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
    local_58 = *local_48;
    local_60._M_current =
         (anon_struct_120_15_f999644b *)
         std::vector<particle_info,_std::allocator<particle_info>_>::begin
                   (in_stack_ffffffffffffff68);
    std::vector<particle_info,_std::allocator<particle_info>_>::end(in_stack_ffffffffffffff68);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
                          *)in_stack_ffffffffffffff70,
                         (__normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
                          *)in_stack_ffffffffffffff68);
      if (!bVar1) break;
      this_00 = (particleSamples *)
                __gnu_cxx::
                __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
                ::operator*(&local_60);
      bVar1 = decide_to_pick_OSCAR(this_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff8c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff8c);
      if (bVar1) {
        std::
        vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
        ::operator[]((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                      *)local_20,(long)local_24);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back(in_RDI,__x);
      }
      __gnu_cxx::
      __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
      ::operator++(&local_60);
    }
    local_24 = local_24 + 1;
    __gnu_cxx::
    __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void particleSamples::filter_particles(
    const int PoI_monval, vector<vector<particle_info> *> *full_list,
    vector<vector<particle_info> *> *filted_list) {
    // clean out the previous record
    clear_out_previous_record(filted_list);

    int i = 0;
    for (auto &ev_i : (*full_list)) {
        filted_list->push_back(new vector<particle_info>);
        for (auto &part_i : (*ev_i)) {
            bool pick_flag = decide_to_pick_OSCAR(PoI_monval, part_i.monval);
            if (pick_flag) {
                (*filted_list)[i]->push_back(part_i);
            }
        }
        i++;
    }
}